

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_event_trigger.c
# Opt level: O2

event_ctx * event_ctx_create(event_packet *ea,event_trigger trigger,void *parent)

{
  event_ctx *__arg;
  
  __arg = (event_ctx *)malloc(0x98);
  if (__arg == (event_ctx *)0x0) {
    _mpp_log_l(2,0,"allocate event ctx failed\n",0);
  }
  else {
    if (0x80 < ea->cnt) {
      __assert_fail("ea->cnt <= 128",
                    "/workspace/llm4binary/github/license_c_cmakelists/HermanChen[P]mpp/test/mpp_event_trigger.c"
                    ,0xd0,
                    "struct event_ctx *event_ctx_create(struct event_packet *, event_trigger, void *)"
                   );
    }
    *(undefined4 *)&__arg[0x11].notify = 0;
    __arg[0x10].notify = (_func_int_void_ptr *)ea;
    __arg->notify = event_notify;
    __arg[1].notify = (_func_int_void_ptr *)trigger;
    __arg[0x12].notify = (_func_int_void_ptr *)parent;
    *(undefined4 *)&__arg[0xf].notify = 1;
    pthread_create((pthread_t *)(__arg + 0xe),(pthread_attr_t *)0x0,event_trigger_thread,__arg);
  }
  return __arg;
}

Assistant:

struct event_ctx* event_ctx_create(struct event_packet *ea,
                                   event_trigger trigger, void *parent)
{
    struct event_ctx_impl *ctx = (struct event_ctx_impl *)malloc(sizeof(*ctx));

    if (ctx == NULL) {
        mpp_err("allocate event ctx failed\n");
        return NULL;
    }

    assert(ea->cnt <= 128);

    ctx->event_idx = 0;
    ctx->ea = ea;

    ctx->notify = event_notify;
    ctx->trigger = trigger;
    ctx->parent = parent;

    ctx->flag = 1;
    pthread_create(&ctx->thr, NULL, event_trigger_thread, ctx);

    return (struct event_ctx *)ctx;
}